

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

int_type __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
::getUnbiasedNormalizedExponent
          (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
           *this)

{
  ushort uVar1;
  uint uVar2;
  short sVar3;
  uint_type significand_bits;
  
  uVar1 = (this->value_).data_;
  _significand_bits = (uint)uVar1;
  if ((uVar1 & 0x7fff) == 0) {
    return 0;
  }
  if ((uVar1 >> 10 & 0x1f) == 0) {
    sVar3 = -0xf;
    if ((uVar1 >> 9 & 1) == 0) {
      sVar3 = -0xf;
      do {
        sVar3 = sVar3 + -1;
        uVar2 = _significand_bits >> 8;
        _significand_bits = _significand_bits * 2;
      } while ((uVar2 & 1) == 0);
    }
  }
  else {
    sVar3 = (uVar1 >> 10 & 0x1f) - 0xf;
  }
  return sVar3;
}

Assistant:

uint_type data() const { return data_; }